

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  curl_off_t cVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char in_AL;
  int iVar8;
  FormInfo *pFVar9;
  int *piVar10;
  char *pcVar11;
  FormInfo *pFVar12;
  long *plVar13;
  curl_slist *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  size_t sVar17;
  size_t sVar18;
  curl_httppost *pcVar19;
  uint uVar20;
  undefined8 in_RCX;
  size_t i;
  FormInfo *pFVar21;
  ulong uVar22;
  char **ppcVar23;
  curl_httppost *pcVar24;
  undefined8 in_RDX;
  curl_httppost **ppcVar25;
  FormInfo *ptr_1;
  undefined8 in_R8;
  undefined8 in_R9;
  int *piVar26;
  CURLFORMcode CVar27;
  FormInfo *ptr;
  curl_slist *pcVar28;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char *local_140;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar20 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar9 = (FormInfo *)(*Curl_ccalloc)(1,0x68);
  if (pFVar9 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar28 = (curl_slist *)0x0;
  piVar26 = (int *)0x0;
  CVar27 = CURL_FORMADD_OK;
  pFVar21 = pFVar9;
  bVar4 = false;
switchD_00534c5f_caseD_9:
  pFVar12 = pFVar9;
  if (CVar27 == CURL_FORMADD_OK) {
    if ((bool)(piVar26 != (int *)0x0 & bVar4)) goto code_r0x00534bf4;
    uVar22 = (ulong)uVar20;
    if (uVar22 < 0x29) {
      uVar20 = uVar20 + 8;
      piVar10 = (int *)((long)local_e8 + uVar22);
    }
    else {
      piVar10 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar8 = *piVar10;
    if (iVar8 != 0x11) goto LAB_00534c4b;
    CVar27 = CURL_FORMADD_OK;
    pcVar24 = (curl_httppost *)0x0;
    pFVar21 = pFVar9;
    pcVar11 = (char *)0x0;
    goto LAB_0053543d;
  }
  for (; pFVar12 != (FormInfo *)0x0; pFVar12 = pFVar12->more) {
    if (pFVar12->name_alloc == true) {
      (*Curl_cfree)(pFVar12->name);
      pFVar12->name = (char *)0x0;
      pFVar12->name_alloc = false;
    }
    if (pFVar12->value_alloc == true) {
      (*Curl_cfree)(pFVar12->value);
      pFVar12->value = (char *)0x0;
      pFVar12->value_alloc = false;
    }
    if (pFVar12->contenttype_alloc == true) {
      (*Curl_cfree)(pFVar12->contenttype);
      pFVar12->contenttype = (char *)0x0;
      pFVar12->contenttype_alloc = false;
    }
    if (pFVar12->showfilename_alloc == true) {
      (*Curl_cfree)(pFVar12->showfilename);
      pFVar12->showfilename = (char *)0x0;
      pFVar12->showfilename_alloc = false;
    }
  }
  goto LAB_0053579e;
code_r0x00534bf4:
  iVar8 = *piVar26;
  pcVar28 = *(curl_slist **)(piVar26 + 2);
  piVar26 = piVar26 + 4;
  CVar27 = CURL_FORMADD_OK;
  bVar4 = false;
  if (iVar8 == 0x11) goto switchD_00534c5f_caseD_9;
  bVar4 = true;
LAB_00534c4b:
  CVar27 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar28;
  switch(iVar8) {
  case 2:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 4;
  case 1:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->name == (char *)0x0) {
      if (!bVar4) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pFVar21->name = (char *)pcVar14;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00534c5f_caseD_9;
  case 3:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->namelength == 0) {
      if (!bVar4) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar21->namelength = (size_t)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_00534c5f_caseD_9;
  case 5:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 8;
  case 4:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->value != (char *)0x0) goto switchD_00534c5f_caseD_9;
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00534c5f_caseD_9;
    break;
  case 7:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar21->flags & 10) != 0) goto switchD_00534c5f_caseD_9;
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00534c5f_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar21->value = pcVar11;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_00534c5f_caseD_9;
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 2;
    goto LAB_00535379;
  case 8:
    CVar27 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar7 = !bVar4;
    bVar4 = true;
    if (bVar7) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar26 = (int *)*puVar15;
      bVar4 = piVar26 != (int *)0x0;
      CVar27 = (uint)(piVar26 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00534c5f_caseD_9;
  case 10:
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar21->value != (char *)0x0) {
      CVar27 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar21->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
      goto switchD_00534c5f_caseD_9;
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar11 == (char *)0x0) goto switchD_00534c5f_caseD_9;
      pFVar12 = AddFormInfo(pcVar11,(char *)0x0,pFVar21);
      if (pFVar12 == (FormInfo *)0x0) goto LAB_00535385;
      pFVar12->value_alloc = true;
      goto LAB_0053513e;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00534c5f_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar21->value = pcVar11;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_00534c5f_caseD_9;
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 1;
LAB_00535379:
    pFVar21->value_alloc = true;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_00534c5f_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->showfilename == (char *)0x0) {
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      pFVar21->showfilename = pcVar11;
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar11 != (char *)0x0) {
        pFVar21->showfilename_alloc = true;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00534c5f_caseD_9;
  case 0xc:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x30;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->buffer != (char *)0x0) goto switchD_00534c5f_caseD_9;
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00534c5f_caseD_9;
    pFVar21->buffer = (char *)pcVar14;
    break;
  case 0xd:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->bufferlength == 0) {
      if (!bVar4) {
        uVar22 = (ulong)uVar20;
        if (uVar22 < 0x29) {
          uVar20 = uVar20 + 8;
          plVar13 = (long *)((long)local_e8 + uVar22);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar21->bufferlength = (size_t)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_00534c5f_caseD_9;
  case 0xe:
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar22);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar21->contenttype == (char *)0x0) {
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
        pFVar21->contenttype = pcVar11;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar11 != (char *)0x0) {
          pFVar21->contenttype_alloc = true;
          CVar27 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00534c5f_caseD_9;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar21->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
    goto switchD_00534c5f_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_00534c5f_caseD_9;
    pFVar12 = AddFormInfo((char *)0x0,pcVar11,pFVar21);
    if (pFVar12 == (FormInfo *)0x0) {
LAB_00535385:
      (*Curl_cfree)(pcVar11);
      CVar27 = CURL_FORMADD_MEMORY;
      goto switchD_00534c5f_caseD_9;
    }
    pFVar12->contenttype_alloc = true;
LAB_0053513e:
    CVar27 = CURL_FORMADD_OK;
    pFVar21 = pFVar12;
    goto switchD_00534c5f_caseD_9;
  case 0xf:
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->contentheader == (curl_slist *)0x0) {
      pFVar21->contentheader = pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_00534c5f_caseD_9;
  case 0x13:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x40;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar21->userp != (char *)0x0) goto switchD_00534c5f_caseD_9;
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00534c5f_caseD_9;
    pFVar21->userp = (char *)pcVar14;
    break;
  case 0x14:
    *(byte *)&pFVar21->flags = (byte)pFVar21->flags | 0x80;
  case 6:
    if (!bVar4) {
      uVar22 = (ulong)uVar20;
      if (uVar22 < 0x29) {
        uVar20 = uVar20 + 8;
        plVar13 = (long *)((long)local_e8 + uVar22);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    pFVar21->contentslength = (curl_off_t)pcVar14;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_00534c5f_caseD_9;
  }
  pFVar21->value = (char *)pcVar14;
  CVar27 = CURL_FORMADD_OK;
  goto switchD_00534c5f_caseD_9;
LAB_0053543d:
  if (pFVar21 != (FormInfo *)0x0) {
    pcVar16 = pFVar21->name;
    if (pcVar16 == (char *)0x0) {
      if (pcVar24 == (curl_httppost *)0x0) goto LAB_0053571f;
LAB_00535466:
      uVar22 = pFVar21->flags;
      if (((((pFVar21->contentslength != 0 & (byte)uVar22) != 0) || (((uint)uVar22 & 9) == 9)) ||
          (uVar20 = ~(uint)uVar22, (uVar20 & 10) == 0)) ||
         ((uVar20 & 0x30) == 0 && pFVar21->buffer == (char *)0x0)) goto LAB_0053571f;
      if (((uVar22 & 0x11) != 0) && (pFVar21->contenttype == (char *)0x0)) {
        ppcVar23 = &pFVar21->showfilename;
        if ((uVar22 & 0x10) == 0) {
          ppcVar23 = &pFVar21->value;
        }
        pcVar16 = Curl_mime_contenttype(*ppcVar23);
        if (pcVar16 == (char *)0x0) {
          pcVar16 = pcVar11;
        }
        if (pcVar16 == (char *)0x0) {
          pcVar16 = "application/octet-stream";
        }
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        pFVar21->contenttype = pcVar16;
        if (pcVar16 != (char *)0x0) {
          pFVar21->contenttype_alloc = true;
          pcVar16 = pFVar21->name;
          goto LAB_00535505;
        }
LAB_00535725:
        CVar27 = CURL_FORMADD_MEMORY;
        goto LAB_00535787;
      }
LAB_00535505:
      if ((pcVar16 != (char *)0x0) && (pFVar21->namelength != 0)) {
        sVar17 = 0;
        while (pFVar21->namelength != sVar17) {
          pcVar1 = pcVar16 + sVar17;
          sVar17 = sVar17 + 1;
          if (*pcVar1 == '\0') {
            CVar27 = CURL_FORMADD_NULL;
            goto LAB_00535787;
          }
        }
      }
      uVar22 = pFVar21->flags;
      if (pFVar21 == pFVar9 && (uVar22 & 4) == 0) {
        if (pcVar16 != (char *)0x0) {
          sVar17 = pFVar21->namelength;
          if (sVar17 == 0) {
            sVar17 = strlen(pcVar16);
          }
          pcVar16 = (char *)Curl_memdup0(pcVar16,sVar17);
          pFVar21->name = pcVar16;
          if (pcVar16 != (char *)0x0) {
            pFVar21->name_alloc = true;
            uVar22 = pFVar21->flags;
            goto LAB_0053557b;
          }
        }
        goto LAB_00535725;
      }
LAB_0053557b:
      local_140 = pFVar21->value;
      if ((uVar22 & 0x6b) == 0) {
        if (local_140 == (char *)0x0) {
          local_140 = (char *)0x0;
        }
        else {
          sVar17 = pFVar21->contentslength;
          if (sVar17 == 0) {
            sVar18 = strlen(local_140);
            sVar17 = sVar18 + 1;
          }
          local_140 = (char *)Curl_memdup(local_140,sVar17);
          pFVar21->value = local_140;
          if (local_140 == (char *)0x0) goto LAB_00535725;
          pFVar21->value_alloc = true;
          pcVar16 = pFVar21->name;
          uVar22 = pFVar21->flags;
        }
      }
      sVar18 = pFVar21->namelength;
      cVar2 = pFVar21->contentslength;
      pcVar1 = pFVar21->buffer;
      sVar17 = pFVar21->bufferlength;
      pcVar3 = pFVar21->contenttype;
      pcVar28 = pFVar21->contentheader;
      pcVar5 = pFVar21->showfilename;
      pcVar6 = pFVar21->userp;
      if (pcVar16 != (char *)0x0 && sVar18 == 0) {
        sVar18 = strlen(pcVar16);
      }
      if ((((long)sVar17 < 0) || ((long)sVar18 < 0)) ||
         (pcVar19 = (curl_httppost *)(*Curl_ccalloc)(1,0x70), pcVar19 == (curl_httppost *)0x0))
      goto LAB_00535725;
      pcVar19->name = pcVar16;
      pcVar19->namelength = sVar18;
      pcVar19->contents = local_140;
      pcVar19->contentlen = cVar2;
      pcVar19->buffer = pcVar1;
      pcVar19->bufferlength = sVar17;
      pcVar19->contenttype = pcVar3;
      pcVar19->contentheader = pcVar28;
      pcVar19->showfilename = pcVar5;
      pcVar19->userp = pcVar6;
      pcVar19->flags = uVar22 | 0x80;
      if (pcVar24 == (curl_httppost *)0x0) {
        pcVar24 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar24 = (curl_httppost *)httppost;
        }
        pcVar24->next = pcVar19;
        ppcVar25 = last_post;
      }
      else {
        pcVar19->more = pcVar24->more;
        ppcVar25 = &pcVar24->more;
      }
      *ppcVar25 = pcVar19;
      ppcVar23 = &pFVar21->contenttype;
      pFVar21 = pFVar21->more;
      pcVar24 = pcVar19;
      if (*ppcVar23 != (char *)0x0) {
        pcVar11 = *ppcVar23;
      }
      goto LAB_0053543d;
    }
    if (pFVar21->value != (char *)0x0 || pcVar24 != (curl_httppost *)0x0) goto LAB_00535466;
LAB_0053571f:
    CVar27 = CURL_FORMADD_INCOMPLETE;
LAB_00535787:
    for (; pFVar21 != (FormInfo *)0x0; pFVar21 = pFVar21->more) {
      if (pFVar21->name_alloc == true) {
        (*Curl_cfree)(pFVar21->name);
        pFVar21->name = (char *)0x0;
        pFVar21->name_alloc = false;
      }
      if (pFVar21->value_alloc == true) {
        (*Curl_cfree)(pFVar21->value);
        pFVar21->value = (char *)0x0;
        pFVar21->value_alloc = false;
      }
      if (pFVar21->contenttype_alloc == true) {
        (*Curl_cfree)(pFVar21->contenttype);
        pFVar21->contenttype = (char *)0x0;
        pFVar21->contenttype_alloc = false;
      }
      if (pFVar21->showfilename_alloc == true) {
        (*Curl_cfree)(pFVar21->showfilename);
        pFVar21->showfilename = (char *)0x0;
        pFVar21->showfilename_alloc = false;
      }
    }
  }
LAB_0053579e:
  while (pFVar9 != (FormInfo *)0x0) {
    pFVar21 = pFVar9->more;
    (*Curl_cfree)(pFVar9);
    pFVar9 = pFVar21;
  }
  return CVar27;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}